

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O2

int bit_encode_write(bit_encode_t *be,uchar *bits,int nbits)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = (uint)be->bbits;
  uVar4 = nbits + uVar3;
  if ((int)uVar4 < 8) {
    be->buf = be->buf | (*bits >> (8U - (char)nbits & 0x1f)) << (8U - (char)uVar4 & 0x1f);
  }
  else {
    uVar1 = uVar3;
    for (uVar2 = 0; (uVar4 & 0xfffffff8) != uVar2; uVar2 = uVar2 + 8) {
      fputc((uint)(byte)(*bits >> ((byte)uVar1 & 0x1f) | be->buf),(FILE *)be->fh);
      uVar1 = (uint)be->bbits;
      be->buf = *bits << (8 - be->bbits & 0x1f);
      bits = bits + 1;
    }
    uVar4 = (uVar3 + nbits) - (int)uVar2;
  }
  be->bbits = (uchar)uVar4;
  return nbits;
}

Assistant:

int
bit_encode_write(bit_encode_t *be, unsigned char const *bits, int nbits)
{
    int tbits;

    tbits = nbits + be->bbits;
    if (tbits < 8)  {
        /* Append to buffer. */
        be->buf |= ((bits[0] >> (8 - nbits)) << (8 - tbits));
    }
    else {
        int i = 0;
        while (tbits >= 8) {
            /* Shift bits out of the buffer and splice with high-order bits */
            fputc(be->buf | ((bits[i]) >> be->bbits), be->fh);
            /* Put low-order bits back into buffer */
            be->buf = (bits[i] << (8 - be->bbits)) & 0xff;
            tbits -= 8;
            ++i;
        }
    }
    /* tbits contains remaining number of  bits. */
    be->bbits = tbits;

    return nbits;
}